

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Reader.cpp
# Opt level: O0

bool ZXing::OneD::IsStartGuard(PatternView *window,int spaceInPixel)

{
  value_type vVar1;
  value_type vVar2;
  int iVar3;
  undefined4 in_ESI;
  PatternView *in_RDI;
  double dVar4;
  double unaff_retaddr;
  int in_stack_0000000c;
  FixedPattern<4,_4,_false> *in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined1 local_15;
  undefined2 uVar5;
  undefined2 uVar6;
  
  uVar5 = 1;
  uVar6 = 1;
  dVar4 = IsPattern<false,4,4>
                    ((PatternView *)CONCAT44(spaceInPixel,in_stack_00000018),in_stack_00000010,
                     in_stack_0000000c,unaff_retaddr,(double)in_RDI);
  local_15 = false;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    vVar1 = PatternView::operator[](in_RDI,4);
    vVar2 = PatternView::operator[](in_RDI,5);
    local_15 = false;
    if ((int)((uint)vVar2 * 3 + -2) < (int)(uint)vVar1) {
      iVar3 = RowReader::OneToFourBitPattern<6,9>
                        ((PatternView *)CONCAT44(in_ESI,CONCAT22(uVar6,uVar5)));
      local_15 = iVar3 == 0x15e;
    }
  }
  return local_15;
}

Assistant:

static bool IsStartGuard(const PatternView& window, int spaceInPixel)
{
	// The complete start pattern is FixedPattern<CHAR_LEN, CHAR_SUM>{1, 1, 1, 1, 4, 1}.
	// Use only the first 4 elements which results in more than a 2x speedup. This is counter-intuitive since we save at
	// most 1/3rd of the loop iterations in FindPattern. The reason might be a successful vectorization with the limited
	// pattern size that is missed otherwise. We check for the remaining 2 slots for plausibility of the 4:1 ratio.
	return IsPattern(window, FixedPattern<4, 4>{1, 1, 1, 1}, spaceInPixel, QUIET_ZONE_SCALE * 12) &&
		   window[4] > 3 * window[5] - 2 &&
		   RowReader::OneToFourBitPattern<CHAR_LEN, CHAR_SUM>(window) == ASTERISK_ENCODING;
}